

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_rp__findresult nk_rp__skyline_find_best_pos(nk_rp_context *c,int width,int height)

{
  nk_rp__findresult nVar1;
  int iVar2;
  uint local_70;
  int local_6c;
  int local_68;
  int waste_1;
  int y_1;
  int xpos;
  int waste;
  int y;
  nk_rp_node **best;
  nk_rp_node *tail;
  nk_rp_node *node;
  nk_rp_node **prev;
  uint local_30;
  int best_y;
  int best_x;
  int best_waste;
  int height_local;
  int width_local;
  nk_rp_context *c_local;
  nk_rp__findresult fr;
  
  best_y = 0x40000000;
  prev._4_4_ = 0x40000000;
  _waste = (nk_rp_node *)0x0;
  iVar2 = width + c->align + -1;
  best_waste = iVar2 - iVar2 % c->align;
  best_x = height;
  _height_local = c;
  if (best_waste % c->align != 0) {
    __assert_fail("width % c->align == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x29d3,
                  "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                 );
  }
  tail = c->active_head;
  node = (nk_rp_node *)&c->active_head;
  while ((int)((uint)tail->x + best_waste) <= _height_local->width) {
    xpos = nk_rp__skyline_find_min_y(_height_local,tail,(uint)tail->x,best_waste,&y_1);
    if (_height_local->heuristic == 0) {
      if (xpos < prev._4_4_) {
        _waste = node;
        prev._4_4_ = xpos;
      }
    }
    else if ((xpos + best_x <= _height_local->height) &&
            ((xpos < prev._4_4_ || ((xpos == prev._4_4_ && (y_1 < best_y)))))) {
      best_y = y_1;
      _waste = node;
      prev._4_4_ = xpos;
    }
    node = (nk_rp_node *)&tail->next;
    tail = tail->next;
  }
  if (_waste == (nk_rp_node *)0x0) {
    local_70 = 0;
  }
  else {
    local_70 = (uint)(*(nk_rp_node **)_waste)->x;
  }
  local_30 = local_70;
  if (_height_local->heuristic == 1) {
    tail = _height_local->active_head;
    node = (nk_rp_node *)&_height_local->active_head;
    for (best = (nk_rp_node **)_height_local->active_head; (int)(uint)*(ushort *)best < best_waste;
        best = (nk_rp_node **)best[1]) {
    }
    for (; best != (nk_rp_node **)0x0; best = (nk_rp_node **)best[1]) {
      waste_1 = (uint)*(ushort *)best - best_waste;
      if (waste_1 < 0) {
        __assert_fail("xpos >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x2a0d,
                      "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                     );
      }
      while ((int)(uint)tail->next->x <= waste_1) {
        node = (nk_rp_node *)&tail->next;
        tail = tail->next;
      }
      if (((int)(uint)tail->next->x <= waste_1) || (waste_1 < (int)(uint)tail->x)) {
        __assert_fail("node->next->x > xpos && node->x <= xpos",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x2a13,
                      "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                     );
      }
      local_68 = nk_rp__skyline_find_min_y(_height_local,tail,waste_1,best_waste,&local_6c);
      if (((local_68 + best_x < _height_local->height) && (local_68 <= prev._4_4_)) &&
         (((local_68 < prev._4_4_ || (local_6c < best_y)) ||
          ((local_6c == best_y && (waste_1 < (int)local_30)))))) {
        local_30 = waste_1;
        if (prev._4_4_ < local_68) {
          __assert_fail("y <= best_y",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x2a19,
                        "struct nk_rp__findresult nk_rp__skyline_find_best_pos(struct nk_rp_context *, int, int)"
                       );
        }
        best_y = local_6c;
        _waste = node;
        prev._4_4_ = local_68;
      }
    }
  }
  nVar1.y = prev._4_4_;
  nVar1.x = local_30;
  nVar1.prev_link = (nk_rp_node **)_waste;
  return nVar1;
}

Assistant:

NK_INTERN struct nk_rp__findresult
nk_rp__skyline_find_best_pos(struct nk_rp_context *c, int width, int height)
{
    int best_waste = (1<<30), best_x, best_y = (1 << 30);
    struct nk_rp__findresult fr;
    struct nk_rp_node **prev, *node, *tail, **best = 0;

    /* align to multiple of c->align */
    width = (width + c->align - 1);
    width -= width % c->align;
    NK_ASSERT(width % c->align == 0);

    node = c->active_head;
    prev = &c->active_head;
    while (node->x + width <= c->width) {
        int y,waste;
        y = nk_rp__skyline_find_min_y(c, node, node->x, width, &waste);
        /* actually just want to test BL */
        if (c->heuristic == NK_RP_HEURISTIC_Skyline_BL_sortHeight) {
            /* bottom left */
            if (y < best_y) {
            best_y = y;
            best = prev;
            }
        } else {
            /* best-fit */
            if (y + height <= c->height) {
                /* can only use it if it first vertically */
                if (y < best_y || (y == best_y && waste < best_waste)) {
                    best_y = y;
                    best_waste = waste;
                    best = prev;
                }
            }
        }
        prev = &node->next;
        node = node->next;
    }
    best_x = (best == 0) ? 0 : (*best)->x;

    /* if doing best-fit (BF), we also have to try aligning right edge to each node position */
    /* */
    /* e.g, if fitting */
    /* */
    /*     ____________________ */
    /*    |____________________| */
    /* */
    /*            into */
    /* */
    /*   |                         | */
    /*   |             ____________| */
    /*   |____________| */
    /* */
    /* then right-aligned reduces waste, but bottom-left BL is always chooses left-aligned */
    /* */
    /* This makes BF take about 2x the time */
    if (c->heuristic == NK_RP_HEURISTIC_Skyline_BF_sortHeight)
    {
        tail = c->active_head;
        node = c->active_head;
        prev = &c->active_head;
        /* find first node that's admissible */
        while (tail->x < width)
            tail = tail->next;
        while (tail)
        {
            int xpos = tail->x - width;
            int y,waste;
            NK_ASSERT(xpos >= 0);
            /* find the left position that matches this */
            while (node->next->x <= xpos) {
                prev = &node->next;
                node = node->next;
            }
            NK_ASSERT(node->next->x > xpos && node->x <= xpos);
            y = nk_rp__skyline_find_min_y(c, node, xpos, width, &waste);
            if (y + height < c->height) {
                if (y <= best_y) {
                    if (y < best_y || waste < best_waste || (waste==best_waste && xpos < best_x)) {
                        best_x = xpos;
                        NK_ASSERT(y <= best_y);
                        best_y = y;
                        best_waste = waste;
                        best = prev;
                    }
                }
            }
            tail = tail->next;
        }
    }
    fr.prev_link = best;
    fr.x = best_x;
    fr.y = best_y;
    return fr;
}